

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricTimeControlType::~IfcElectricTimeControlType
          (IfcElectricTimeControlType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x914d18;
  *(undefined8 *)&this->field_0x1e0 = 0x914e80;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x914d40;
  (this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x914d68;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x914d90;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x914db8;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x914de0;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x914e08;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x914e30;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.field_0x1b0 = 0x914e58;
  puVar1 = *(undefined1 **)&(this->super_IfcFlowControllerType).field_0x1c0;
  if (puVar1 != &this->field_0x1d0) {
    operator_delete(puVar1);
  }
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x9154a8;
  *(undefined8 *)&this->field_0x1e0 = 0x915570;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x9154d0;
  (this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x9154f8;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x915520;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x915548;
  puVar1 = *(undefined1 **)
            &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x158;
  if (puVar1 != &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
                 super_IfcDistributionElementType.super_IfcElementType.field_0x168) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__00914eb8);
  operator_delete(this);
  return;
}

Assistant:

IfcElectricTimeControlType() : Object("IfcElectricTimeControlType") {}